

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

string * httplib::detail::find_content_type
                   (string *__return_storage_ptr__,string *path,
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *user_data,string *default_content_type)

{
  pointer pcVar1;
  uint uVar2;
  const_iterator cVar3;
  size_type sVar4;
  string ext;
  allocator<char> local_41;
  string local_40;
  
  file_extension(&local_40,path);
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&user_data->_M_t,&local_40);
  if ((_Rb_tree_header *)cVar3._M_node != &(user_data->_M_t)._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,*(char **)(cVar3._M_node + 2),&local_41);
    goto LAB_00141713;
  }
  if (local_40._M_string_length != 0) {
    sVar4 = 0;
    uVar2 = 0;
    do {
      uVar2 = (uint)(byte)local_40._M_dataplus._M_p[sVar4] ^ uVar2 * 0x21 & 0x3ffffff;
      sVar4 = sVar4 + 1;
    } while (local_40._M_string_length != sVar4);
    if (uVar2 < 0x1f164) {
      if (uVar2 < 0x1d1b9) {
        if (uVar2 < 0x1a6df) {
          if (uVar2 < 0xdd9) {
            if (uVar2 == 0x76d) {
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)__return_storage_ptr__,"application/x-7z-compressed","");
              goto LAB_00141713;
            }
            if (uVar2 == 0xd3d) {
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)__return_storage_ptr__,"application/gzip","");
              goto LAB_00141713;
            }
          }
          else {
            if (uVar2 == 0xdd9) {
LAB_00141c6a:
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)__return_storage_ptr__,"text/javascript","");
              goto LAB_00141713;
            }
            if (uVar2 == 0x1a2c3) {
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)__return_storage_ptr__,"text/css","");
              goto LAB_00141713;
            }
            if (uVar2 == 0x1a2c6) {
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)__return_storage_ptr__,"text/csv","");
              goto LAB_00141713;
            }
          }
        }
        else if (uVar2 < 0x1c97d) {
          if (uVar2 == 0x1a6df) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)__return_storage_ptr__,"image/bmp","");
            goto LAB_00141713;
          }
          if (uVar2 == 0x1b0f1) goto LAB_00141c48;
          if (uVar2 == 0x1b288) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)__return_storage_ptr__,"image/gif","");
            goto LAB_00141713;
          }
        }
        else {
          if (uVar2 == 0x1c97d) {
LAB_00141a88:
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)__return_storage_ptr__,"image/jpeg","");
            goto LAB_00141713;
          }
          if (uVar2 == 0x1cb45) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)__return_storage_ptr__,"image/x-icon","");
            goto LAB_00141713;
          }
          if (uVar2 == 0x1d0f2) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)__return_storage_ptr__,"application/pdf","");
            goto LAB_00141713;
          }
        }
      }
      else if (uVar2 < 0x1dee6) {
        if (uVar2 < 0x1db34) {
          if (uVar2 == 0x1d1b9) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)__return_storage_ptr__,"image/png","");
            goto LAB_00141713;
          }
          if (uVar2 == 0x1d5fd) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)__return_storage_ptr__,"font/otf","");
            goto LAB_00141713;
          }
        }
        else {
          if (uVar2 == 0x1db34) goto LAB_00141c6a;
          if (uVar2 == 0x1de29) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)__return_storage_ptr__,"video/mp4","");
            goto LAB_00141713;
          }
          if (uVar2 == 0x1de2e) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)__return_storage_ptr__,"audio/mp3","");
            goto LAB_00141713;
          }
        }
      }
      else if (uVar2 < 0x1e25b) {
        if (uVar2 == 0x1dee6) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,"font/ttf","");
          goto LAB_00141713;
        }
        if (uVar2 == 0x1e078) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,"text/plain","");
          goto LAB_00141713;
        }
        if (uVar2 == 0x1e147) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,"application/x-tar","");
          goto LAB_00141713;
        }
      }
      else {
        if (uVar2 == 0x1e25b) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,"image/tiff","");
          goto LAB_00141713;
        }
        if (uVar2 == 0x1e322) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,"image/svg+xml","");
          goto LAB_00141713;
        }
        if (uVar2 == 0x1e692) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,"application/rss+xml","");
          goto LAB_00141713;
        }
      }
    }
    else if (uVar2 < 0x3dad1f) {
      if (uVar2 < 0x371b38) {
        if (uVar2 < 0x1f580) {
          if (uVar2 == 0x1f164) {
LAB_00141c26:
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)__return_storage_ptr__,"application/xhtml+xml","");
            goto LAB_00141713;
          }
          if (uVar2 == 0x1f1d9) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)__return_storage_ptr__,"application/xml","");
            goto LAB_00141713;
          }
        }
        else {
          if (uVar2 == 0x1f580) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)__return_storage_ptr__,"audio/wave","");
            goto LAB_00141713;
          }
          if (uVar2 == 0x1f7f6) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)__return_storage_ptr__,"text/vtt","");
            goto LAB_00141713;
          }
          if (uVar2 == 0x20a43) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)__return_storage_ptr__,"application/zip","");
            goto LAB_00141713;
          }
        }
      }
      else if (uVar2 < 0x37cf7d) {
        if (uVar2 == 0x371b38) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,"image/apng","");
          goto LAB_00141713;
        }
        if (uVar2 == 0x372318) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,"image/avif","");
          goto LAB_00141713;
        }
        if (uVar2 == 0x372b57) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,"application/atom+xml","");
          goto LAB_00141713;
        }
      }
      else {
        if (uVar2 == 0x37cf7d) {
LAB_00141c48:
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,"text/html","");
          goto LAB_00141713;
        }
        if (uVar2 == 0x3adb38) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,"application/json","");
          goto LAB_00141713;
        }
        if (uVar2 == 0x3af938) goto LAB_00141a88;
      }
    }
    else if (uVar2 < 0x409771) {
      if (uVar2 < 0x3e2ddd) {
        if (uVar2 == 0x3dad1f) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,"video/mpeg","");
          goto LAB_00141713;
        }
        if (uVar2 == 0x3daddb) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,"audio/mpeg","");
          goto LAB_00141713;
        }
      }
      else {
        if (uVar2 == 0x3e2ddd) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,"image/tiff","");
          goto LAB_00141713;
        }
        if (uVar2 == 0x3ff093) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,"application/xslt+xml","");
          goto LAB_00141713;
        }
        if (uVar2 == 0x409760) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,"image/webp","");
          goto LAB_00141713;
        }
      }
    }
    else if (uVar2 < 0x40c278) {
      if (uVar2 == 0x409771) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,"audio/webm","");
        goto LAB_00141713;
      }
      if (uVar2 == 0x40977d) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,"video/webm","");
        goto LAB_00141713;
      }
      if (uVar2 == 0x40a648) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,"application/wasm","");
        goto LAB_00141713;
      }
    }
    else {
      if (uVar2 == 0x40c278) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,"font/woff","");
        goto LAB_00141713;
      }
      if (uVar2 == 0x43cec5) goto LAB_00141c26;
      if (uVar2 == 0x59114a) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,"font/woff2","");
        goto LAB_00141713;
      }
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (default_content_type->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + default_content_type->_M_string_length
            );
LAB_00141713:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string
find_content_type(const std::string &path,
                  const std::map<std::string, std::string> &user_data,
                  const std::string &default_content_type) {
  auto ext = file_extension(path);

  auto it = user_data.find(ext);
  if (it != user_data.end()) { return it->second.c_str(); }

  using udl::operator""_t;

  switch (str2tag(ext)) {
  default: return default_content_type;

  case "css"_t: return "text/css";
  case "csv"_t: return "text/csv";
  case "htm"_t:
  case "html"_t: return "text/html";
  case "js"_t:
  case "mjs"_t: return "text/javascript";
  case "txt"_t: return "text/plain";
  case "vtt"_t: return "text/vtt";

  case "apng"_t: return "image/apng";
  case "avif"_t: return "image/avif";
  case "bmp"_t: return "image/bmp";
  case "gif"_t: return "image/gif";
  case "png"_t: return "image/png";
  case "svg"_t: return "image/svg+xml";
  case "webp"_t: return "image/webp";
  case "ico"_t: return "image/x-icon";
  case "tif"_t: return "image/tiff";
  case "tiff"_t: return "image/tiff";
  case "jpg"_t:
  case "jpeg"_t: return "image/jpeg";

  case "mp4"_t: return "video/mp4";
  case "mpeg"_t: return "video/mpeg";
  case "webm"_t: return "video/webm";

  case "mp3"_t: return "audio/mp3";
  case "mpga"_t: return "audio/mpeg";
  case "weba"_t: return "audio/webm";
  case "wav"_t: return "audio/wave";

  case "otf"_t: return "font/otf";
  case "ttf"_t: return "font/ttf";
  case "woff"_t: return "font/woff";
  case "woff2"_t: return "font/woff2";

  case "7z"_t: return "application/x-7z-compressed";
  case "atom"_t: return "application/atom+xml";
  case "pdf"_t: return "application/pdf";
  case "json"_t: return "application/json";
  case "rss"_t: return "application/rss+xml";
  case "tar"_t: return "application/x-tar";
  case "xht"_t:
  case "xhtml"_t: return "application/xhtml+xml";
  case "xslt"_t: return "application/xslt+xml";
  case "xml"_t: return "application/xml";
  case "gz"_t: return "application/gzip";
  case "zip"_t: return "application/zip";
  case "wasm"_t: return "application/wasm";
  }
}